

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O0

void __thiscall RandomizerWorld::~RandomizerWorld(RandomizerWorld *this)

{
  WorldNode *this_00;
  WorldPath *this_01;
  WorldRegion *this_02;
  HintSource *this_03;
  SpawnLocation *this_04;
  WorldTeleportTree *pWVar1;
  Item *this_05;
  bool bVar2;
  reference ppIVar3;
  reference __in;
  type *ppWVar4;
  reference ppWVar5;
  reference ppWVar6;
  reference ppHVar7;
  reference __in_00;
  type *ppSVar8;
  reference __in_01;
  type *ppWVar9;
  type *ppWVar10;
  reference ppIVar11;
  Item *item;
  iterator __end1_7;
  iterator __begin1_7;
  vector<Item_*,_std::allocator<Item_*>_> *__range1_7;
  type *tree_2;
  type *tree_1;
  __normal_iterator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_*,_std::vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>_>
  local_108;
  iterator __end1_6;
  iterator __begin1_6;
  vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
  *__range1_6;
  type *spawn_loc;
  type *key_1;
  _Self local_d8;
  iterator __end1_5;
  iterator __begin1_5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
  *__range1_5;
  HintSource *hint_source;
  iterator __end1_4;
  iterator __begin1_4;
  vector<HintSource_*,_std::allocator<HintSource_*>_> *__range1_4;
  WorldRegion *region;
  iterator __end1_3;
  iterator __begin1_3;
  vector<WorldRegion_*,_std::allocator<WorldRegion_*>_> *__range1_3;
  WorldPath *path;
  iterator __end1_2;
  iterator __begin1_2;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> *__range1_2;
  type *node;
  type *key;
  _Self local_48;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
  *__range1_1;
  ItemSource *source;
  iterator __end1;
  iterator __begin1;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range1;
  RandomizerWorld *this_local;
  
  __end1 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::begin(&this->_item_sources);
  source = (ItemSource *)
           std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::end(&this->_item_sources);
  while (bVar2 = __gnu_cxx::
                 operator==<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                           (&__end1,(__normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                     *)&source), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppIVar3 = __gnu_cxx::
              __normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
              ::operator*(&__end1);
    if (*ppIVar3 != (ItemSource *)0x0) {
      (*(*ppIVar3)->_vptr_ItemSource[1])();
    }
    __gnu_cxx::
    __normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
             ::begin(&this->_nodes);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
       ::end(&this->_nodes);
  while (bVar2 = std::operator==(&__end1_1,&local_48), ((bVar2 ^ 0xffU) & 1) != 0) {
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>
           ::operator*(&__end1_1);
    std::get<0ul,std::__cxx11::string_const,WorldNode*>(__in);
    ppWVar4 = std::get<1ul,std::__cxx11::string_const,WorldNode*>(__in);
    this_00 = *ppWVar4;
    if (this_00 != (WorldNode *)0x0) {
      WorldNode::~WorldNode(this_00);
      operator_delete(this_00,0xa8);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::begin(&this->_paths);
  path = (WorldPath *)std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::end(&this->_paths);
  while (bVar2 = __gnu_cxx::
                 operator==<WorldPath_**,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>
                           (&__end1_2,
                            (__normal_iterator<WorldPath_**,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>
                             *)&path), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppWVar5 = __gnu_cxx::
              __normal_iterator<WorldPath_**,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>
              ::operator*(&__end1_2);
    this_01 = *ppWVar5;
    if (this_01 != (WorldPath *)0x0) {
      WorldPath::~WorldPath(this_01);
      operator_delete(this_01,0x60);
    }
    __gnu_cxx::
    __normal_iterator<WorldPath_**,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>::
    operator++(&__end1_2);
  }
  __end1_3 = std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>::begin(&this->_regions);
  region = (WorldRegion *)
           std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>::end(&this->_regions);
  while (bVar2 = __gnu_cxx::
                 operator==<WorldRegion_**,_std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>_>
                           (&__end1_3,
                            (__normal_iterator<WorldRegion_**,_std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>_>
                             *)&region), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppWVar6 = __gnu_cxx::
              __normal_iterator<WorldRegion_**,_std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>_>
              ::operator*(&__end1_3);
    this_02 = *ppWVar6;
    if (this_02 != (WorldRegion *)0x0) {
      WorldRegion::~WorldRegion(this_02);
      operator_delete(this_02,0x78);
    }
    __gnu_cxx::
    __normal_iterator<WorldRegion_**,_std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>_>::
    operator++(&__end1_3);
  }
  __end1_4 = std::vector<HintSource_*,_std::allocator<HintSource_*>_>::begin(&this->_hint_sources);
  hint_source = (HintSource *)
                std::vector<HintSource_*,_std::allocator<HintSource_*>_>::end(&this->_hint_sources);
  while (bVar2 = __gnu_cxx::
                 operator==<HintSource_**,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
                           (&__end1_4,
                            (__normal_iterator<HintSource_**,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
                             *)&hint_source), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppHVar7 = __gnu_cxx::
              __normal_iterator<HintSource_**,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
              ::operator*(&__end1_4);
    this_03 = *ppHVar7;
    if (this_03 != (HintSource *)0x0) {
      HintSource::~HintSource(this_03);
      operator_delete(this_03,0x90);
    }
    __gnu_cxx::
    __normal_iterator<HintSource_**,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>::
    operator++(&__end1_4);
  }
  __end1_5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
             ::begin(&this->_available_spawn_locations);
  local_d8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
       ::end(&this->_available_spawn_locations);
  while (bVar2 = std::operator==(&__end1_5,&local_d8), ((bVar2 ^ 0xffU) & 1) != 0) {
    __in_00 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>
              ::operator*(&__end1_5);
    std::get<0ul,std::__cxx11::string_const,SpawnLocation*>(__in_00);
    ppSVar8 = std::get<1ul,std::__cxx11::string_const,SpawnLocation*>(__in_00);
    this_04 = *ppSVar8;
    if (this_04 != (SpawnLocation *)0x0) {
      SpawnLocation::~SpawnLocation(this_04);
      operator_delete(this_04,0x50);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>
    ::operator++(&__end1_5);
  }
  __end1_6 = std::
             vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
             ::begin(&this->_teleport_tree_pairs);
  local_108._M_current =
       (pair<WorldTeleportTree_*,_WorldTeleportTree_*> *)
       std::
       vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
       ::end(&this->_teleport_tree_pairs);
  while (bVar2 = __gnu_cxx::
                 operator==<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_*,_std::vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>_>
                           (&__end1_6,&local_108), ((bVar2 ^ 0xffU) & 1) != 0) {
    __in_01 = __gnu_cxx::
              __normal_iterator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_*,_std::vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>_>
              ::operator*(&__end1_6);
    ppWVar9 = std::get<0ul,WorldTeleportTree*,WorldTeleportTree*>(__in_01);
    ppWVar10 = std::get<1ul,WorldTeleportTree*,WorldTeleportTree*>(__in_01);
    if ((*ppWVar9 != *ppWVar10) && (pWVar1 = *ppWVar10, pWVar1 != (WorldTeleportTree *)0x0)) {
      WorldTeleportTree::~WorldTeleportTree(pWVar1);
      operator_delete(pWVar1,0x58);
    }
    pWVar1 = *ppWVar9;
    if (pWVar1 != (WorldTeleportTree *)0x0) {
      WorldTeleportTree::~WorldTeleportTree(pWVar1);
      operator_delete(pWVar1,0x58);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_*,_std::vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>_>
    ::operator++(&__end1_6);
  }
  __end1_7 = std::vector<Item_*,_std::allocator<Item_*>_>::begin(&this->_archipelago_items);
  item = (Item *)std::vector<Item_*,_std::allocator<Item_*>_>::end(&this->_archipelago_items);
  while (bVar2 = __gnu_cxx::operator==<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                           (&__end1_7,
                            (__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                             *)&item), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppIVar11 = __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
               ::operator*(&__end1_7);
    this_05 = *ppIVar11;
    if (this_05 != (Item *)0x0) {
      Item::~Item(this_05);
      operator_delete(this_05,0x40);
    }
    __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::operator++
              (&__end1_7);
  }
  std::vector<Item_*,_std::allocator<Item_*>_>::~vector(&this->_archipelago_items);
  std::
  vector<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
  ::~vector(&this->_teleport_tree_pairs);
  std::
  map<Entity_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Entity_*>,_std::allocator<std::pair<Entity_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->_custom_dialogues);
  std::vector<EntityType_*,_std::allocator<EntityType_*>_>::~vector(&this->_fahl_enemies);
  std::vector<HintSource_*,_std::allocator<HintSource_*>_>::~vector(&this->_used_hint_sources);
  std::vector<HintSource_*,_std::allocator<HintSource_*>_>::~vector(&this->_hint_sources);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
  ::~map(&this->_available_spawn_locations);
  std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>::~vector(&this->_regions);
  std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::~vector(&this->_paths);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
  ::~map(&this->_nodes);
  std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::~vector(&this->_item_sources);
  World::~World(&this->super_World);
  return;
}

Assistant:

RandomizerWorld::~RandomizerWorld()
{
    for (ItemSource* source : _item_sources)
        delete source;
    for (auto& [key, node] : _nodes)
        delete node;
    for (WorldPath* path : _paths)
        delete path;
    for (WorldRegion* region : _regions)
        delete region;
    for (HintSource* hint_source : _hint_sources)
        delete hint_source;
    for (auto& [key, spawn_loc] : _available_spawn_locations)
        delete spawn_loc;
    for (auto& [tree_1, tree_2] : _teleport_tree_pairs)
    {
        if(tree_1 != tree_2)
            delete tree_2;
        delete tree_1;
    }
    for(Item* item : _archipelago_items)
        delete item;
}